

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::StringPtr> * __thiscall
kj::ArrayBuilder<kj::StringPtr>::operator=
          (ArrayBuilder<kj::StringPtr> *this,ArrayBuilder<kj::StringPtr> *other)

{
  StringPtr *pSVar1;
  RemoveConst<kj::StringPtr> *pRVar2;
  StringPtr *pSVar3;
  ArrayDisposer *pAVar4;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (StringPtr *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (StringPtr *)0x0;
    this->pos = (RemoveConst<kj::StringPtr> *)0x0;
    this->endPtr = (StringPtr *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x10,(long)pRVar2 - (long)pSVar1 >> 4,
               (long)pSVar3 - (long)pSVar1 >> 4,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (StringPtr *)0x0;
  other->pos = (RemoveConst<kj::StringPtr> *)0x0;
  other->endPtr = (StringPtr *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }